

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::UnknownFieldSerializerLite
               (uint8 *ptr,uint32 offset,uint32 tag,uint32 has_offset,CodedOutputStream *output)

{
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pCVar1;
  CodedOutputStream *output_local;
  uint32 has_offset_local;
  uint32 tag_local;
  uint32 offset_local;
  uint8 *ptr_local;
  string *local_20;
  
  if (((uint)((InternalMetadata *)(ptr + offset))->ptr_ & 1) == 1) {
    pCVar1 = InternalMetadata::
             PtrValue<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
                       ((InternalMetadata *)(ptr + offset));
    local_20 = &pCVar1->unknown_fields;
  }
  else {
    local_20 = GetEmptyString_abi_cxx11_();
  }
  io::CodedOutputStream::WriteString(output,local_20);
  return;
}

Assistant:

void UnknownFieldSerializerLite(const uint8* ptr, uint32 offset, uint32 tag,
                                uint32 has_offset,
                                io::CodedOutputStream* output) {
  output->WriteString(
      reinterpret_cast<const InternalMetadata*>(ptr + offset)
          ->unknown_fields<std::string>(&internal::GetEmptyString));
}